

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O0

void llvm::remove_bad_alloc_error_handler(void)

{
  lock_guard<std::mutex> local_10;
  lock_guard<std::mutex> Lock;
  
  std::lock_guard<std::mutex>::lock_guard(&local_10,&BadAllocErrorHandlerMutex);
  BadAllocErrorHandler_abi_cxx11_ = (fatal_error_handler_t)0x0;
  BadAllocErrorHandlerUserData = (void *)0x0;
  std::lock_guard<std::mutex>::~lock_guard(&local_10);
  return;
}

Assistant:

void llvm::remove_bad_alloc_error_handler() {
#if LLVM_ENABLE_THREADS == 1
  std::lock_guard<std::mutex> Lock(BadAllocErrorHandlerMutex);
#endif
  BadAllocErrorHandler = nullptr;
  BadAllocErrorHandlerUserData = nullptr;
}